

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_err.cpp
# Opt level: O3

void UCNV_FROM_U_CALLBACK_STOP_63
               (void *context,UConverterFromUnicodeArgs *fromUArgs,UChar *codeUnits,int32_t length,
               UChar32 codePoint,UConverterCallbackReason reason,UErrorCode *err)

{
  uint uVar1;
  
  if (reason != UCNV_UNASSIGNED) {
    return;
  }
  if (codePoint < 0x200b) {
    if (codePoint < 0x17b4) {
      if (codePoint < 0x115f) {
        if (((codePoint == 0xad) || (codePoint == 0x34f)) || (codePoint == 0x61c))
        goto LAB_002c0eb1;
        goto LAB_002c0ebd;
      }
      uVar1 = codePoint - 0x115f;
    }
    else {
      if (codePoint - 0x180bU < 4) goto LAB_002c0eb1;
      uVar1 = codePoint - 0x17b4;
    }
    if (uVar1 < 2) goto LAB_002c0eb1;
  }
  else if ((codePoint - 0x200bU < 0x24) &&
          ((0xf8000001fU >> ((ulong)(codePoint - 0x200bU) & 0x3f) & 1) != 0)) goto LAB_002c0eb1;
LAB_002c0ebd:
  if (((((codePoint != 0x3164 && (codePoint & 0xfffffff0U) != 0x2060) &&
        ((codePoint & 0xfffff000U) != 0xe0000)) &&
       ((7 < codePoint - 0x1d173U &&
        (((codePoint & 0xfffffffcU) != 0x1bca0 && (8 < codePoint - 0xfff0U)))))) &&
      (codePoint != 0xffa0)) && ((codePoint != 0xfeff && ((codePoint & 0xfffffff0U) != 0xfe00)))) {
    return;
  }
LAB_002c0eb1:
  *err = U_ZERO_ERROR;
  return;
}

Assistant:

U_CAPI void    U_EXPORT2
UCNV_FROM_U_CALLBACK_STOP (
                  const void *context,
                  UConverterFromUnicodeArgs *fromUArgs,
                  const UChar* codeUnits,
                  int32_t length,
                  UChar32 codePoint,
                  UConverterCallbackReason reason,
                  UErrorCode * err)
{
    (void)context;
    (void)fromUArgs;
    (void)codeUnits;
    (void)length;
    if (reason == UCNV_UNASSIGNED && IS_DEFAULT_IGNORABLE_CODE_POINT(codePoint))
    {
        /*
         * Skip if the codepoint has unicode property of default ignorable.
         */
        *err = U_ZERO_ERROR;
    }
    /* the caller must have set the error code accordingly */
    return;
}